

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

realtype N_VL1Norm_Serial(N_Vector x)

{
  realtype *xd;
  realtype sum;
  sunindextype N;
  sunindextype i;
  N_Vector x_local;
  
  xd = (realtype *)0x0;
  for (N = 0; N < *x->content; N = N + 1) {
    xd = (realtype *)(ABS(*(double *)(*(long *)((long)x->content + 0x10) + N * 8)) + (double)xd);
  }
  return (realtype)xd;
}

Assistant:

realtype N_VL1Norm_Serial(N_Vector x)
{
  sunindextype i, N;
  realtype sum, *xd;

  sum = ZERO;
  xd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  for (i = 0; i<N; i++)
    sum += SUNRabs(xd[i]);

  return(sum);
}